

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O1

int OpenSSLWrapper::SslServerContext::ALPN_CB
              (SSL *param_1,uchar **out,uchar *outlen,uchar *in,uint inlen,void *arg)

{
  byte *pbVar1;
  byte bVar2;
  long *plVar3;
  size_t sVar4;
  int iVar5;
  uint uVar6;
  undefined8 *puVar7;
  size_t sVar8;
  bool bVar9;
  bool bVar10;
  string strProtokoll;
  long *local_70;
  size_t local_68;
  long local_60 [2];
  byte *local_50;
  undefined8 *local_48;
  uchar **local_40;
  byte *local_38;
  
  uVar6 = 1;
  if (((out != (uchar **)0x0) && (in != (uchar *)0x0)) && (arg != (void *)0x0)) {
    puVar7 = *(undefined8 **)((long)arg + 0x48);
    local_48 = *(undefined8 **)((long)arg + 0x50);
    bVar9 = puVar7 == local_48;
    local_40 = out;
    local_38 = outlen;
    while (!bVar9) {
      uVar6 = 0;
      local_50 = in;
      while (local_70 = local_60, uVar6 < inlen) {
        pbVar1 = in + 1;
        bVar2 = *in;
        in = in + (ulong)bVar2 + 1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pbVar1,in);
        sVar4 = local_68;
        plVar3 = local_70;
        if (local_68 != 0) {
          sVar8 = 0;
          do {
            iVar5 = tolower((int)*(char *)((long)plVar3 + sVar8));
            *(char *)((long)plVar3 + sVar8) = (char)iVar5;
            sVar8 = sVar8 + 1;
          } while (sVar4 != sVar8);
        }
        if (local_68 == puVar7[1]) {
          if (local_68 == 0) {
            bVar10 = true;
          }
          else {
            iVar5 = bcmp(local_70,(void *)*puVar7,local_68);
            bVar10 = iVar5 == 0;
          }
        }
        else {
          bVar10 = false;
        }
        if (bVar10) {
          *local_40 = pbVar1;
          *local_38 = bVar2;
          in = pbVar1;
        }
        else {
          uVar6 = uVar6 + bVar2 + 1;
        }
        if (local_70 != local_60) {
          operator_delete(local_70,local_60[0] + 1);
        }
        if (bVar10) goto LAB_00122771;
      }
      puVar7 = puVar7 + 4;
      in = local_50;
      bVar9 = puVar7 == local_48;
    }
LAB_00122771:
    uVar6 = (uint)bVar9;
  }
  return uVar6;
}

Assistant:

int SslServerContext::ALPN_CB(SSL* /*ssl*/, const unsigned char **out, unsigned char *outlen, const unsigned char *in, unsigned int inlen, void *arg)
    {
        SslServerContext* pSslCtx = static_cast<SslServerContext*>(arg);
        if (pSslCtx == nullptr || in == nullptr || out == nullptr)
            return 1;

        for (auto& strProt : pSslCtx->m_vstrAlpnProtoList)
        {
            const uint8_t* inTmp = in;
            for (unsigned int i = 0; i < inlen;)
            {
                uint8_t nLen = *inTmp++;
                string strProtokoll(reinterpret_cast<const char*>(inTmp), static_cast<size_t>(nLen));
                transform(begin(strProtokoll), end(strProtokoll), begin(strProtokoll), [](char c) noexcept { return static_cast<char>(::tolower(c)); });

                if (strProtokoll == strProt)
                {
                    *out = inTmp, *outlen = nLen;
                    return 0;
                }
                inTmp += nLen;
                i += nLen + 1;
            }
        }

        return 1;
    }